

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_strfold(int n,mpc_val_t **xs)

{
  size_t sVar1;
  void *pvVar2;
  long local_30;
  size_t l;
  int i;
  mpc_val_t **xs_local;
  void *pvStack_10;
  int n_local;
  
  local_30 = 0;
  if (n == 0) {
    pvStack_10 = calloc(1,1);
  }
  else {
    for (l._4_4_ = 0; l._4_4_ < n; l._4_4_ = l._4_4_ + 1) {
      sVar1 = strlen((char *)xs[l._4_4_]);
      local_30 = sVar1 + local_30;
    }
    pvVar2 = realloc(*xs,local_30 + 1);
    *xs = pvVar2;
    for (l._4_4_ = 1; l._4_4_ < n; l._4_4_ = l._4_4_ + 1) {
      strcat((char *)*xs,(char *)xs[l._4_4_]);
      free(xs[l._4_4_]);
    }
    pvStack_10 = *xs;
  }
  return pvStack_10;
}

Assistant:

mpc_val_t *mpcf_strfold(int n, mpc_val_t **xs) {
  int i;
  size_t l = 0;

  if (n == 0) { return calloc(1, 1); }

  for (i = 0; i < n; i++) { l += strlen(xs[i]); }

  xs[0] = realloc(xs[0], l + 1);

  for (i = 1; i < n; i++) {
    strcat(xs[0], xs[i]); free(xs[i]);
  }

  return xs[0];
}